

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

uint __thiscall jpgd::jpeg_decoder::get_char(jpeg_decoder *this,bool *pPadding_flag)

{
  int iVar1;
  byte *pbVar2;
  undefined1 *in_RSI;
  jpeg_decoder *in_RDI;
  uint c;
  int t;
  uint local_4;
  
  if ((in_RDI->m_in_buf_left == 0) && (prep_in_buffer(in_RDI), in_RDI->m_in_buf_left == 0)) {
    *in_RSI = 1;
    iVar1 = in_RDI->m_tem_flag;
    in_RDI->m_tem_flag = in_RDI->m_tem_flag ^ 1;
    if (iVar1 == 0) {
      local_4 = 0xff;
    }
    else {
      local_4 = 0xd9;
    }
  }
  else {
    *in_RSI = 0;
    pbVar2 = in_RDI->m_pIn_buf_ofs;
    in_RDI->m_pIn_buf_ofs = pbVar2 + 1;
    local_4 = (uint)*pbVar2;
    in_RDI->m_in_buf_left = in_RDI->m_in_buf_left + -1;
  }
  return local_4;
}

Assistant:

inline uint jpeg_decoder::get_char(bool* pPadding_flag)
	{
		if (!m_in_buf_left)
		{
			prep_in_buffer();
			if (!m_in_buf_left)
			{
				*pPadding_flag = true;
				int t = m_tem_flag;
				m_tem_flag ^= 1;
				if (t)
					return 0xD9;
				else
					return 0xFF;
			}
		}

		*pPadding_flag = false;

		uint c = *m_pIn_buf_ofs++;
		m_in_buf_left--;

		return c;
	}